

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O2

uint64_t mul_mod_p(uint64_t a,uint64_t b)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = 0;
  for (; b != 0; b = b >> 1) {
    if ((b & 1) == 0) {
      uVar2 = -a - 0x3b;
    }
    else {
      uVar2 = -a - 0x3b;
      uVar3 = a + 0x3b;
      if (uVar1 < uVar2) {
        uVar3 = a;
      }
      uVar1 = uVar1 + uVar3;
    }
    uVar3 = a * 2;
    bVar4 = a < uVar2;
    a = a * 2 + 0x3b;
    if (bVar4) {
      a = uVar3;
    }
  }
  return uVar1;
}

Assistant:

static inline uint64_t
mul_mod_p(uint64_t a, uint64_t b) {
	uint64_t m = 0;
	while(b) {
		if(b&1) {
			uint64_t t = P-a;
			if ( m >= t) {
				m -= t;
			} else {
				m += a;
			}
		}
		if (a >= P - a) {
			a = a * 2 - P;
		} else {
			a = a * 2;
		}
		b>>=1;
	}
	return m;
}